

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase71::run(TestCase71 *this)

{
  uint uVar1;
  int local_4c;
  bool local_45;
  int local_44;
  bool _kj_shouldLog_4;
  int local_3c;
  bool _kj_shouldLog_3;
  int local_34;
  bool _kj_shouldLog_2;
  uint local_2c;
  uint uStack_28;
  bool _kj_shouldLog_1;
  bool local_21;
  ShiftingWireValue<unsigned_int,_4UL> *pSStack_20;
  bool _kj_shouldLog;
  WireValue<uint32_t>_conflict *vals;
  TestCase71 *pTStack_10;
  byte bytes [4];
  TestCase71 *this_local;
  
  vals._4_4_ = 0x78563412;
  pSStack_20 = (ShiftingWireValue<unsigned_int,_4UL> *)((long)&vals + 4);
  pTStack_10 = this;
  uVar1 = ShiftingWireValue<unsigned_int,_4UL>::get(pSStack_20);
  if (uVar1 != 0x78563412) {
    local_21 = kj::_::Debug::shouldLog(ERROR);
    while (local_21 != false) {
      uStack_28 = 0x78563412;
      local_2c = ShiftingWireValue<unsigned_int,_4UL>::get(pSStack_20);
      kj::_::Debug::log<char_const(&)[50],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x4c,ERROR,
                 "\"failed: expected \" \"(0x78563412u) == (vals[0].get())\", 0x78563412u, vals[0].get()"
                 ,(char (*) [50])"failed: expected (0x78563412u) == (vals[0].get())",
                 &stack0xffffffffffffffd8,&local_2c);
      local_21 = false;
    }
  }
  ShiftingWireValue<unsigned_int,_4UL>::set(pSStack_20,0x23456789);
  if (vals._4_1_ != -0x77) {
    _kj_shouldLog_2 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      local_34 = 0x89;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x50,ERROR,"\"failed: expected \" \"(0x89) == (bytes[0])\", 0x89, bytes[0]",
                 (char (*) [38])"failed: expected (0x89) == (bytes[0])",&local_34,
                 (uchar *)((long)&vals + 4));
      _kj_shouldLog_2 = false;
    }
  }
  if (vals._5_1_ != 'g') {
    _kj_shouldLog_3 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_3c = 0x67;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x51,ERROR,"\"failed: expected \" \"(0x67) == (bytes[1])\", 0x67, bytes[1]",
                 (char (*) [38])"failed: expected (0x67) == (bytes[1])",&local_3c,
                 (uchar *)((long)&vals + 5));
      _kj_shouldLog_3 = false;
    }
  }
  if (vals._6_1_ != 'E') {
    _kj_shouldLog_4 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_4 != false) {
      local_44 = 0x45;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x52,ERROR,"\"failed: expected \" \"(0x45) == (bytes[2])\", 0x45, bytes[2]",
                 (char (*) [38])"failed: expected (0x45) == (bytes[2])",&local_44,
                 (uchar *)((long)&vals + 6));
      _kj_shouldLog_4 = false;
    }
  }
  if (vals._7_1_ != '#') {
    local_45 = kj::_::Debug::shouldLog(ERROR);
    while (local_45 != false) {
      local_4c = 0x23;
      kj::_::Debug::log<char_const(&)[38],int,unsigned_char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/endian-test.c++"
                 ,0x53,ERROR,"\"failed: expected \" \"(0x23) == (bytes[3])\", 0x23, bytes[3]",
                 (char (*) [38])"failed: expected (0x23) == (bytes[3])",&local_4c,
                 (uchar *)((long)&vals + 7));
      local_45 = false;
    }
  }
  return;
}

Assistant:

TEST(Endian, FourBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint32_t>* vals = reinterpret_cast<WireValue<uint32_t>*>(bytes);

  EXPECT_EQ(0x78563412u, vals[0].get());

  vals[0].set(0x23456789);

  EXPECT_EQ(0x89, bytes[0]);
  EXPECT_EQ(0x67, bytes[1]);
  EXPECT_EQ(0x45, bytes[2]);
  EXPECT_EQ(0x23, bytes[3]);
}